

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsIterationStaticSlices(void)

{
  uint *puVar1;
  StaticSliceIterator<2UL> SVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  initializer_list<int> __l;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::StaticSliceIterator<2UL>_>
  IVar8;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> values;
  Span<const_int,_18446744073709551615UL> span;
  
  span.m_ptr = (pointer)0x200000001;
  span.m_size.m_size = 0x400000003;
  __l._M_len = 6;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&values,__l,&local_41);
  span.m_ptr = (pointer)0x0;
  if ((long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.m_ptr = values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  span.m_size.m_size =
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  IVar8 = MILBlob::Util::Span<int_const,18446744073709551615ul>::IterateSlices<2ul>
                    ((Span<int_const,18446744073709551615ul> *)&span);
  SVar2 = IVar8.m_begin.m_ptr;
  uVar6 = 0;
  do {
    if (SVar2.m_ptr == IVar8.m_end.m_ptr.m_ptr) {
      iVar4 = 0;
      if (uVar6 == 6) goto LAB_001776b2;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x254);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(counter) == (6)");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_001776af;
    }
    if (*SVar2.m_ptr != (uVar6 | 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x24f);
      poVar3 = std::operator<<(poVar3,": error: ");
      pcVar5 = "(row.Get<0>()) == (counter + 1)";
      goto LAB_00177690;
    }
    puVar1 = (uint *)SVar2.m_ptr + 1;
    uVar7 = uVar6 + 2;
    SVar2.m_ptr = SVar2.m_ptr + 2;
    uVar6 = *puVar1;
  } while (*puVar1 == uVar7);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x250);
  poVar3 = std::operator<<(poVar3,": error: ");
  pcVar5 = "(row.Get<1>()) == (counter + 2)";
LAB_00177690:
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_001776af:
  iVar4 = 1;
LAB_001776b2:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return iVar4;
}

Assistant:

int testSpanTestsIterationStaticSlices()
{
    const std::vector<int> values = {1, 2, 3, 4, 5, 6};
    auto span = MakeSpan(values);

    // iterate 3 values at a time
    int counter = 0;
    for (auto row : span.IterateSlices<2>()) {
        ML_ASSERT_EQ(row.Size(), size_t(2));
        ML_ASSERT_EQ(row.Get<0>(), counter + 1);
        ML_ASSERT_EQ(row.Get<1>(), counter + 2);

        counter += 2;
    }
    ML_ASSERT_EQ(counter, 6);

    return 0;
}